

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FutureState.h
# Opt level: O1

void __thiscall
async_simple::FutureState<std::error_code>::ContinuationReference::detach
          (ContinuationReference *this)

{
  atomic<unsigned_char> *paVar1;
  FutureState<std::error_code> *pFVar2;
  
  if (this->_fs != (FutureState<std::error_code> *)0x0) {
    derefContinuation(this->_fs);
    pFVar2 = this->_fs;
    LOCK();
    paVar1 = &pFVar2->_attached;
    (paVar1->super___atomic_base<unsigned_char>)._M_i =
         (paVar1->super___atomic_base<unsigned_char>)._M_i + 0xff;
    UNLOCK();
    if ((paVar1->super___atomic_base<unsigned_char>)._M_i == '\0') {
      std::__detail::__variant::
      _Variant_storage<false,_std::monostate,_std::error_code,_std::__exception_ptr::exception_ptr>
      ::~_Variant_storage((_Variant_storage<false,_std::monostate,_std::error_code,_std::__exception_ptr::exception_ptr>
                           *)&pFVar2->_try_value);
      operator_delete(pFVar2,0x60);
      return;
    }
  }
  return;
}

Assistant:

void detach() {
            if (_fs) {
                _fs->derefContinuation();
                _fs->detachOne();
            }
        }